

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_deflate.cpp
# Opt level: O1

void __thiscall ktx::CommandDeflate::executeDeflate(CommandDeflate *this)

{
  OptionsSingleInSingleOut *filepath;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  undefined8 stream;
  bool bVar4;
  char cVar5;
  int iVar6;
  ulong uVar7;
  pointer psVar8;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 testrun;
  ktxSupercmpScheme extraout_EDX;
  ktxSupercmpScheme extraout_EDX_00;
  ktxSupercmpScheme scheme;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  Reporter *report;
  size_type __rlen;
  pointer psVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar13;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  KTXTexture2 texture;
  OutputStream outputFile;
  path outputPath;
  string newScParams;
  string writerScParams;
  smatch deflateOptionMatch;
  string origWriterName;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> ktx2Stream;
  InputStream inputStream;
  ktxTexture *local_518;
  path local_510;
  undefined1 local_4e8 [40];
  long lStack_4c0;
  string local_4b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_498;
  long lStack_490;
  char local_488;
  undefined7 uStack_487;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_478;
  size_type local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_458;
  char *local_438;
  size_type sStack_430;
  char local_428;
  undefined7 uStack_427;
  Reporter *local_418;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> local_410;
  undefined1 local_3e8 [952];
  
  filepath = &(this->options).super_OptionsSingleInSingleOut;
  report = &(this->super_Command).super_Reporter;
  InputStream::InputStream((InputStream *)local_3e8,&filepath->inputFilepath,report);
  stream = local_3e8._32_8_;
  pcVar2 = (this->options).super_OptionsSingleInSingleOut.inputFilepath._M_dataplus._M_p;
  sVar3 = (this->options).super_OptionsSingleInSingleOut.inputFilepath._M_string_length;
  if (sVar3 == 1) {
    iVar6 = bcmp(pcVar2,"-",1);
    if (iVar6 != 0) goto LAB_00182d02;
    local_4e8._0_8_ = local_4e8 + 0x10;
    local_4e8._16_6_ = 0x6e69647473;
    local_4e8._8_8_ = (pointer)0x5;
  }
  else {
LAB_00182d02:
    local_4e8._0_8_ = local_4e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,pcVar2,pcVar2 + sVar3);
  }
  validateToolInput((istream *)stream,(string *)local_4e8,report);
  pcVar2 = local_4e8 + 0x10;
  if ((pointer)local_4e8._0_8_ != pcVar2) {
    operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ + 1);
  }
  local_518 = (ktxTexture *)0x0;
  local_410._streambuf =
       *(basic_streambuf<char,_std::char_traits<char>_> **)
        (local_3e8._32_8_ + *(long *)(*(long *)local_3e8._32_8_ + -0x18) + 0xe8);
  local_410._vptr_StreambufStream = (_func_int **)&PTR__StreambufStream_0025f618;
  local_410._seek_mode = _S_in|_S_bin;
  local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
  super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
  super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<ktxStream,_std::default_delete<ktxStream>,_true,_true>)operator_new(0x68);
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x40) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
   super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
   super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x60) = 0;
  local_410._destructed = false;
  *(undefined4 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x38) = 3;
  *(undefined1 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x60) = 0;
  *(StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> **)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x40) = &local_410;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x50) = 0;
  *(code **)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>
            ._M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
            super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::read;
  *(code **)((long)local_410._stream._M_t.
                   super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                   super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                   super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 8) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::skip;
  *(code **)((long)local_410._stream._M_t.
                   super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                   super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                   super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x10) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::write;
  *(code **)((long)local_410._stream._M_t.
                   super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                   super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                   super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x18) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::getpos;
  *(code **)((long)local_410._stream._M_t.
                   super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                   super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                   super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x20) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::setpos;
  *(code **)((long)local_410._stream._M_t.
                   super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                   super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                   super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x28) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::getsize;
  *(code **)((long)local_410._stream._M_t.
                   super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                   super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                   super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x30) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::destruct;
  iVar6 = ktxTexture2_CreateFromStream
                    (local_410._stream._M_t.
                     super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                     super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                     super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl,1,&local_518);
  scheme = extraout_EDX;
  if (iVar6 != 0) {
    local_4e8._0_8_ = ktxErrorString(iVar6);
    Reporter::fatal<char_const(&)[34],char_const*>
              (report,INVALID_FILE,(char (*) [34])"Failed to create KTX2 texture: {}",
               (char **)local_4e8);
    scheme = extraout_EDX_00;
  }
  uVar10 = *(uint *)&local_518[1].vvtbl;
  if (uVar10 != 0) {
    if ((uVar10 & 0xfffffffe) == 2) {
      if ((this->options).super_Options.quiet != false) goto LAB_00182eda;
      toString_abi_cxx11_((string *)local_4e8,(ktx *)(ulong)uVar10,scheme);
      Reporter::warning<char_const(&)[46],std::__cxx11::string,std::__cxx11::string&>
                (report,(char (*) [46])"Modifying existing {} supercompression of {}.",
                 (string *)local_4e8,&filepath->inputFilepath);
    }
    else {
      toString_abi_cxx11_((string *)local_4e8,(ktx *)(ulong)uVar10,scheme);
      Reporter::fatal<char_const(&)[60],std::__cxx11::string>
                (report,INVALID_FILE,
                 (char (*) [60])"Cannot further deflate a KTX2 file supercompressed with {}.",
                 (string *)local_4e8);
    }
    if ((pointer)local_4e8._0_8_ != pcVar2) {
      operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ + 1);
    }
  }
LAB_00182eda:
  if ((this->options).super_OptionsDeflate.zstd.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    iVar6 = ktxTexture2_DeflateZstd
                      (local_518,
                       (this->options).super_OptionsDeflate.zstd.
                       super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._M_payload._M_value);
    if (iVar6 != 0) {
      local_4e8._0_8_ = ktxErrorString(iVar6);
      Reporter::fatal<char_const(&)[37],char_const*>
                (report,IO_FAILURE,(char (*) [37])"Zstd deflation failed. KTX Error: {}",
                 (char **)local_4e8);
    }
  }
  if ((this->options).super_OptionsDeflate.zlib.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    iVar6 = ktxTexture2_DeflateZLIB
                      (local_518,
                       (this->options).super_OptionsDeflate.zlib.
                       super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._M_payload._M_value);
    if (iVar6 != 0) {
      local_4e8._0_8_ = ktxErrorString(iVar6);
      Reporter::fatal<char_const(&)[37],char_const*>
                (report,IO_FAILURE,(char (*) [37])"ZLIB deflation failed. KTX Error: {}",
                 (char **)local_4e8);
    }
  }
  local_498._M_current = &local_488;
  lStack_490 = 0;
  local_488 = '\0';
  local_438 = &local_428;
  sStack_430 = 0;
  local_428 = '\0';
  local_4e8._8_8_ = (pointer)0x0;
  local_4e8._16_8_ = local_4e8._16_8_ & 0xffffffffffffff00;
  local_4e8._0_8_ = pcVar2;
  iVar6 = ktxHashList_FindValue(&local_518->kvDataHead,"KTXwriterScParams",&local_4b8,&local_510);
  if (iVar6 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)local_4e8,0,(char *)local_4e8._8_8_,
               (ulong)local_510._M_pathname._M_dataplus._M_p);
  }
  std::__cxx11::string::operator=((string *)&local_498,(string *)local_4e8);
  testrun = extraout_DL;
  if ((pointer)local_4e8._0_8_ != pcVar2) {
    operator_delete((void *)local_4e8._0_8_,(ulong)(local_4e8._16_8_ + 1));
    testrun = extraout_DL_00;
  }
  if (lStack_490 == 0) {
    bVar4 = true;
  }
  else {
    local_510._M_pathname._M_dataplus._M_p = (pointer)&local_510._M_pathname.field_2;
    local_510._M_pathname._M_string_length = 0;
    local_510._M_pathname.field_2._M_allocated_capacity =
         local_510._M_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
    iVar6 = ktxHashList_FindValue(&local_518->kvDataHead,"KTXwriter",&local_4b8,local_4e8);
    testrun = extraout_DL_01;
    if (iVar6 == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_510,0,(char *)local_510._M_pathname._M_string_length,local_4e8._0_8_)
      ;
      testrun = extraout_DL_02;
    }
    if ((char *)local_510._M_pathname._M_string_length == (char *)0x0) {
      bVar4 = true;
    }
    else {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4b8,
                 "ktx (?:create|deflate|encode|transcode)",0x10);
      local_458.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_458._M_begin._M_current = (char *)0x0;
      local_458.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_458.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_4e8._16_8_ = (char *)0x0;
      local_4e8._24_8_ = 0;
      local_4e8._0_8_ = (pointer)0x0;
      local_4e8._8_8_ = (pointer)0x0;
      bVar4 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )local_510._M_pathname._M_dataplus._M_p,
                         (char *)(local_510._M_pathname._M_string_length +
                                 (long)local_510._M_pathname._M_dataplus._M_p),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_4e8,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4b8,0);
      if ((pointer)local_4e8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ - local_4e8._0_8_);
      }
      if (bVar4) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::_M_compile
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4b8,
                   " ?--(?:zlib|zstd) [1-9][0-9]?","",0x10);
        std::__detail::
        __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                  (local_498,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(local_498._M_current + lStack_490),&local_458,
                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4b8,0);
      }
      else {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::_M_compile
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4b8,"ktxsc|toktx",
                   "",0x10);
        local_4e8._16_8_ = (char *)0x0;
        local_4e8._24_8_ = 0;
        local_4e8._0_8_ = (pointer)0x0;
        local_4e8._8_8_ = (pointer)0x0;
        bVar4 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_510._M_pathname._M_dataplus._M_p,
                           (char *)(local_510._M_pathname._M_string_length +
                                   (long)local_510._M_pathname._M_dataplus._M_p),
                           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_4e8,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4b8,0);
        if ((pointer)local_4e8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ - local_4e8._0_8_);
        }
        if (bVar4) {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::_M_compile
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4b8,
                     " ?--zcmp ?[1-9]?[0-9]?","",0x10);
          std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                    (local_498,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_498._M_current + lStack_490),&local_458,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4b8,0);
        }
        std::__cxx11::string::find((char)&local_510,0x20);
        std::__cxx11::string::substr((ulong)local_4e8,(ulong)&local_510);
        std::__cxx11::string::operator=((string *)&local_438,(string *)local_4e8);
        if ((pointer)local_4e8._0_8_ != pcVar2) {
          operator_delete((void *)local_4e8._0_8_,(ulong)(local_4e8._16_8_ + 1));
        }
      }
      uVar10 = 0;
      local_418 = report;
      while( true ) {
        if (local_458.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_458.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          uVar7 = 0;
        }
        else {
          uVar7 = ((long)local_458.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_458.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 3;
        }
        uVar11 = (ulong)uVar10;
        if (uVar7 <= uVar11) break;
        if (local_458.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_458.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          uVar7 = 0;
        }
        else {
          uVar7 = ((long)local_458.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_458.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 3;
        }
        psVar12 = local_458.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -3;
        if (uVar11 < uVar7) {
          psVar12 = local_458.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar11;
        }
        if ((long)local_458.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_458.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0) {
          uVar7 = 0;
        }
        else {
          uVar7 = ((long)local_458.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_458.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 3;
        }
        psVar8 = local_458.
                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar11;
        if (uVar7 <= uVar11) {
          psVar8 = local_458.
                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -3;
        }
        pcVar9 = (psVar8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current +
                 -(long)(psVar8->
                        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).first._M_current;
        if (psVar8->matched == false) {
          pcVar9 = (char *)0x0;
        }
        std::__cxx11::string::replace
                  ((ulong)&local_498,
                   (long)(psVar12->
                         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).first._M_current - (long)local_458._M_begin._M_current,pcVar9,0x219e6c);
        uVar10 = uVar10 + 1;
      }
      bVar4 = lStack_490 == 0;
      bVar13 = sStack_430 != 0;
      if (local_458.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_458.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_458.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_458.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar4 = bVar4 || bVar13;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4b8);
      report = local_418;
      testrun = extraout_DL_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_pathname._M_dataplus._M_p != &local_510._M_pathname.field_2) {
      operator_delete(local_510._M_pathname._M_dataplus._M_p,
                      local_510._M_pathname.field_2._M_allocated_capacity + 1);
      testrun = extraout_DL_04;
    }
  }
  if (bVar4) {
    version_abi_cxx11_(&local_4b8,(ktx *)(ulong)(this->options).super_OptionsGeneric.testrun,
                       (bool)testrun);
    local_4e8._0_8_ = (this->super_Command).super_Reporter.commandName._M_dataplus._M_p;
    local_4e8._8_8_ = (this->super_Command).super_Reporter.commandName._M_string_length;
    local_4e8._16_8_ = local_4b8._M_dataplus._M_p;
    local_4e8._24_8_ = local_4b8._M_string_length;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_4e8;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x5;
    ::fmt::v10::vformat_abi_cxx11_(&local_510._M_pathname,(v10 *)0x208eb9,fmt,args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    ktxHashList_DeleteKVPair(&local_518->kvDataHead,"KTXwriter");
    ktxHashList_AddKVPair
              (&local_518->kvDataHead,"KTXwriter",(int)local_510._M_pathname._M_string_length + 1,
               local_510._M_pathname._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_pathname._M_dataplus._M_p != &local_510._M_pathname.field_2) {
      operator_delete(local_510._M_pathname._M_dataplus._M_p,
                      local_510._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  local_4e8._0_8_ = (this->options).super_OptionsDeflate.compressOptions._M_dataplus._M_p;
  local_4e8._8_8_ = (this->options).super_OptionsDeflate.compressOptions._M_string_length;
  args_00.field_1.values_ = in_R9.values_;
  args_00.desc_ = (unsigned_long_long)local_4e8;
  fmt_00.size_ = 0xd;
  fmt_00.data_ = (char *)0x2;
  ::fmt::v10::vformat_abi_cxx11_(&local_4b8,(v10 *)0x20cbac,fmt_00,args_00);
  if (*local_4b8._M_dataplus._M_p == ' ') {
    if (lStack_490 == 0) {
      std::__cxx11::string::_M_assign((string *)&local_498);
      std::__cxx11::string::_M_erase((ulong)&local_498,0);
    }
    else if (bVar4) {
      std::__cxx11::string::_M_erase((ulong)&local_4b8,0);
      local_4e8._0_8_ = local_4b8._M_dataplus._M_p;
      local_4e8._8_8_ = local_4b8._M_string_length;
      local_4e8._16_8_ = local_438;
      local_4e8._24_8_ = sStack_430;
      local_4e8._32_8_ = local_498._M_current;
      lStack_4c0 = lStack_490;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_4e8;
      fmt_01.size_ = 0xddd;
      fmt_01.data_ = (char *)0x11;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_510._M_pathname,(v10 *)"{} / (from {}) {}",fmt_01,args_01);
      std::__cxx11::string::operator=((string *)&local_498,(string *)&local_510);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_pathname._M_dataplus._M_p != &local_510._M_pathname.field_2) {
        operator_delete(local_510._M_pathname._M_dataplus._M_p,
                        local_510._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_append((char *)&local_498,(ulong)local_4b8._M_dataplus._M_p);
    }
    ktxHashList_DeleteKVPair(&local_518->kvDataHead,"KTXwriterScParams");
    ktxHashList_AddKVPair
              (&local_518->kvDataHead,"KTXwriterScParams",(int)lStack_490 + 1,local_498._M_current);
    pcVar2 = (this->options).super_OptionsSingleInSingleOut.outputFilepath._M_dataplus._M_p;
    local_478 = &local_468;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_478,pcVar2,
               pcVar2 + (this->options).super_OptionsSingleInSingleOut.outputFilepath.
                        _M_string_length);
    paVar1 = &local_510._M_pathname.field_2;
    if (local_478 == &local_468) {
      local_510._M_pathname.field_2._8_8_ = local_468._8_8_;
      local_510._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_510._M_pathname._M_dataplus._M_p = (pointer)local_478;
    }
    local_510._M_pathname.field_2._M_allocated_capacity._1_7_ =
         local_468._M_allocated_capacity._1_7_;
    local_510._M_pathname.field_2._M_local_buf[0] = local_468._M_local_buf[0];
    local_510._M_pathname._M_string_length = local_470;
    local_470 = 0;
    local_468._M_local_buf[0] = '\0';
    local_478 = &local_468;
    std::filesystem::__cxx11::path::path((path *)local_4e8,&local_510._M_pathname,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_510._M_pathname._M_dataplus._M_p,
                      local_510._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if (local_478 != &local_468) {
      operator_delete(local_478,
                      CONCAT71(local_468._M_allocated_capacity._1_7_,local_468._M_local_buf[0]) + 1)
      ;
    }
    cVar5 = std::filesystem::__cxx11::path::has_parent_path();
    if (cVar5 != '\0') {
      std::filesystem::__cxx11::path::parent_path();
      std::filesystem::create_directories(&local_510);
      std::filesystem::__cxx11::path::~path(&local_510);
    }
    OutputStream::OutputStream
              ((OutputStream *)&local_510,
               &(this->options).super_OptionsSingleInSingleOut.outputFilepath,report);
    OutputStream::writeKTX2((OutputStream *)&local_510,local_518,report);
    OutputStream::~OutputStream((OutputStream *)&local_510);
    std::filesystem::__cxx11::path::~path((path *)local_4e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    if (local_438 != &local_428) {
      operator_delete(local_438,CONCAT71(uStack_427,local_428) + 1);
    }
    if (local_498._M_current != &local_488) {
      operator_delete(local_498._M_current,CONCAT71(uStack_487,local_488) + 1);
    }
    StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::~StreambufStream
              (&local_410);
    if (local_518 != (ktxTexture *)0x0) {
      (*local_518->vtbl->Destroy)(local_518);
      local_518 = (ktxTexture *)0x0;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_3e8 + 0x230));
    std::ios_base::~ios_base((ios_base *)(local_3e8 + 0x2b0));
    std::ifstream::~ifstream(local_3e8 + 0x28);
    if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
      operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
    }
    return;
  }
  __assert_fail("newScParams[0] == \' \'",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_deflate.cpp"
                ,0x123,"void ktx::CommandDeflate::executeDeflate()");
}

Assistant:

void CommandDeflate::executeDeflate() {
    InputStream inputStream(options.inputFilepath, *this);
    validateToolInput(inputStream, fmtInFile(options.inputFilepath), *this);

    KTXTexture2 texture{nullptr};
    StreambufStream<std::streambuf*> ktx2Stream{inputStream->rdbuf(), std::ios::in | std::ios::binary};
    auto ret = ktxTexture2_CreateFromStream(ktx2Stream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, texture.pHandle());
    if (ret != KTX_SUCCESS)
        fatal(rc::INVALID_FILE, "Failed to create KTX2 texture: {}", ktxErrorString(ret));

    if (texture->supercompressionScheme != KTX_SS_NONE) {
        switch (texture->supercompressionScheme) {
          case KTX_SS_ZLIB:
          case KTX_SS_ZSTD:
            if (!options.quiet) {
                warning("Modifying existing {} supercompression of {}.",
                        toString(texture->supercompressionScheme),
                        options.inputFilepath);
            }
            break;
          default:
            fatal(rc::INVALID_FILE,
                  "Cannot further deflate a KTX2 file supercompressed with {}.",
                  toString(texture->supercompressionScheme));
        }
    }

    if (options.zstd) {
        ret = ktxTexture2_DeflateZstd(texture, *options.zstd);
        if (ret != KTX_SUCCESS)
            fatal(rc::IO_FAILURE, "Zstd deflation failed. KTX Error: {}", ktxErrorString(ret));
    }

    if (options.zlib) {
        ret = ktxTexture2_DeflateZLIB(texture, *options.zlib);
        if (ret != KTX_SUCCESS)
            fatal(rc::IO_FAILURE, "ZLIB deflation failed. KTX Error: {}", ktxErrorString(ret));
    }

    const auto& findMetadataValue = [&](const char* const key) {
        const char* value;
        uint32_t valueLen;
        std::string result;
        auto ret = ktxHashList_FindValue(&texture->kvDataHead, key,
                      &valueLen, (void**)&value);
        if (ret == KTX_SUCCESS) {
            // The values we are looking for are required to be NUL terminated.
            result.assign(value, valueLen - 1);
        }
        return result;
    };

    const auto updateMetadataValue = [&](const char* const key,
                                 const std::string& value) {
        ktxHashList_DeleteKVPair(&texture->kvDataHead, key);
        ktxHashList_AddKVPair(&texture->kvDataHead, key,
                static_cast<uint32_t>(value.size() + 1), // +1 to include \0
                value.c_str());
    };

    // ======= KTXwriter and KTXwriterScParams metadata handling =======
    //
    // In order to preserve encoding parameters applied to the data with
    // other apps prior to this deflate operation, `deflate` does the
    // following if KTXwriterScParams data exists in the input file:
    //
    // 1. If the writer was one of the ktx suite (i.e. create or encode)
    //    and KTXwriterScParams contains non-deflate options, use the
    //    original KTXwriter. Replace an existing deflate option with
    //    that currently specified or append it as new.
    //
    //    The original writer will obviously understand its own
    //    non-deflate options and, since it is part of the ktx suite
    //    it will understand the updated or new deflate option that will
    //    be added.
    //
    //    Cheeky! Spec. for KTXwriter says "only the most recent writer
    //    Should be identified." For KTXwriterScParams it says the writer
    //    should "append the (new) options" when "building on operations
    //    done previously." To somewhat resolve the conflict it changes
    //    the previous "only" to "in general."
    //
    // 2. If the writer was another tool, preserve its options in
    //    KTWwriterScParams labelled with its name and append the
    //    currently specified deflate option like so
    //
    //        --zstd 18 | (from <name>) option1 option2 ...
    //
    //    where <name> is the first word of the original KTXwriter metadata,
    //    e.g, "tokt". Rewrite KTXwriter with the name of this tool.
    //
    // 3. If the writer was ktxsc or toktx remove any original deflate
    //    option from the preserved parameters as we know those option
    //    names.

    bool changeWriter = true;
    std::string writerScParams;
    std::string origWriterName;
    writerScParams = findMetadataValue(KTX_WRITER_SCPARAMS_KEY);
    if (!writerScParams.empty()) {
        std::string writer = findMetadataValue(KTX_WRITER_KEY);
        if (!writer.empty()) {
            std::regex e("ktx (?:create|deflate|encode|transcode)");
            std::smatch deflateOptionMatch;
            if (std::regex_search(writer, e)) {
                // Writer is member of the ktx suite.
                // Look for existing deflate option
                e = " ?--(?:zlib|zstd) [1-9][0-9]?";
                (void)std::regex_search(writerScParams, deflateOptionMatch, e);
            } else {
                // Writer is not a member of the ktx suite
                e = "ktxsc|toktx";
                if (std::regex_search(writer, e)) {
                    // Look for toktx/ktxsc deflate option
                    e = " ?--zcmp ?[1-9]?[0-9]?";
                    (void)std::regex_search(writerScParams,
                                            deflateOptionMatch, e);
                }
                origWriterName = writer.substr(0, writer.find_first_of(' '));
            }
            // Remove existing deflate option since its value will not apply
            // to the newly deflated data.
            for (uint32_t i = 0; i < deflateOptionMatch.size(); i++) {
                 writerScParams.replace(deflateOptionMatch.position(i),
                                        deflateOptionMatch.length(i),
                                        "");
            }
            // Does ScParams still have data and is the original writer a
            // member of the ktx suite?
            if (!writerScParams.empty() && origWriterName.empty()) {
                changeWriter = false;
            }
        }
    }

    if (changeWriter) {
        // Create or modify KTXwriter metadata.
        const auto writer = fmt::format("{} {}", commandName, version(options.testrun));
        updateMetadataValue(KTX_WRITER_KEY, writer);
    }

    // Format new writerScParams.
    auto newScParams = fmt::format("{}", options.compressOptions);
    // Options always contain a leading space
    assert(newScParams[0] == ' ');
    if (!writerScParams.empty()) {
        if (changeWriter) {
            // Leading space unneeded as this param will be first.
            newScParams.erase(newScParams.begin());
            writerScParams = fmt::format("{} / (from {}) {}", newScParams,
                                         origWriterName, writerScParams);
        } else {
            writerScParams.append(newScParams);
        }
    } else {
        writerScParams = newScParams;
        writerScParams.erase(writerScParams.begin()); // Erase leading space.
    }

    // Add KTXwriterScParams metadata
    updateMetadataValue(KTX_WRITER_SCPARAMS_KEY, writerScParams);

    // Save output file
    const auto outputPath = std::filesystem::path(DecodeUTF8Path(options.outputFilepath));
    if (outputPath.has_parent_path())
        std::filesystem::create_directories(outputPath.parent_path());

    OutputStream outputFile(options.outputFilepath, *this);
    outputFile.writeKTX2(texture, *this);
}